

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O0

diff_t absl::lts_20240722::time_internal::cctz::detail::impl::ymd_ord(year_t y,month_t m,day_t d)

{
  long lVar1;
  int iVar2;
  long local_50;
  long local_48;
  diff_t doe;
  diff_t doy;
  diff_t yoe;
  diff_t era;
  diff_t eyear;
  day_t d_local;
  month_t m_local;
  year_t y_local;
  
  local_48 = y;
  if (m < '\x03') {
    local_48 = y + -1;
  }
  if (local_48 < 0) {
    local_50 = local_48 + -399;
  }
  else {
    local_50 = local_48;
  }
  lVar1 = local_48 + (local_50 / 400) * -400;
  iVar2 = 9;
  if ('\x02' < m) {
    iVar2 = -3;
  }
  return (local_50 / 400) * 0x23ab1 +
         ((lVar1 * 0x16d + lVar1 / 4) - lVar1 / 100) +
         (long)(((m + iVar2) * 0x99 + 2) / 5 + (int)d + -1) + -0xafa6c;
}

Assistant:

CONSTEXPR_F diff_t ymd_ord(year_t y, month_t m, day_t d) noexcept {
  const diff_t eyear = (m <= 2) ? y - 1 : y;
  const diff_t era = (eyear >= 0 ? eyear : eyear - 399) / 400;
  const diff_t yoe = eyear - era * 400;
  const diff_t doy = (153 * (m + (m > 2 ? -3 : 9)) + 2) / 5 + d - 1;
  const diff_t doe = yoe * 365 + yoe / 4 - yoe / 100 + doy;
  return era * 146097 + doe - 719468;
}